

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void pacf_opt(double *vec,int N,int method,double *par,int M)

{
  if (method == 2) {
    pacf_mle(vec,N,par,M);
    return;
  }
  if (method != 1) {
    if (method == 0) {
      pacf_yw(vec,N,par,M);
      return;
    }
    puts("\n The code only accepts numerical values 0,1 and 2 ");
    puts("\n Method 0 : Yule-Walker ");
    puts("\n Method 1 : Burg ");
    puts("\n Method 2 : Box-Jenkins Conditional MLE ");
    return;
  }
  pacf_burg(vec,N,par,M);
  return;
}

Assistant:

void pacf_opt(double* vec, int N, int method, double* par, int M) {
	// Method 0 : Yule-Walker
	// Method 1 : Burg
	// Method 2 : Box-Jenkins Conditional MLE

	if (method == 0) {
		pacf_yw(vec, N, par, M);
	}
	else if (method == 1) {
		pacf_burg(vec, N, par, M);
	}
	else if (method == 2) {
		pacf_mle(vec, N, par, M);
	}
	else {
		printf("\n The code only accepts numerical values 0,1 and 2 \n");
		printf("\n Method 0 : Yule-Walker \n");
		printf("\n Method 1 : Burg \n");
		printf("\n Method 2 : Box-Jenkins Conditional MLE \n");
	}
}